

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void write_parameter_file(char *fname)

{
  char cVar1;
  undefined *puVar2;
  undefined *puVar3;
  FILE *__s;
  size_t sVar4;
  int i;
  long lVar5;
  int l;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int j;
  long lVar11;
  long lVar12;
  long lVar13;
  int k;
  long lVar14;
  long lVar15;
  
  __s = fopen(fname,"w");
  if (__s != (FILE *)0x0) {
    fwrite("## RNAfold parameter file v2.0\n",0x1f,1,__s);
    lVar11 = 0;
    fprintf(__s,"\n# %s\n","stack");
    fwrite("/*  CG    GC    GU    UG    AU    UA    @  */\n",0x2e,1,__s);
    do {
      display_array((int *)((long)stack37[1] + lVar11 + 4),7,7,(FILE *)__s);
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0xe0);
    lVar11 = 0;
    fprintf(__s,"\n# %s\n","stack_enthalpies");
    fwrite("/*  CG    GC    GU    UG    AU    UA    @  */\n",0x2e,1,__s);
    do {
      display_array((int *)((long)stackdH[1] + lVar11 + 4),7,7,(FILE *)__s);
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0xe0);
    fprintf(__s,"\n# %s\n","mismatch_hairpin");
    lVar11 = 0x2e91d4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_hairpin_enthalpies");
    lVar11 = 0x2e94f4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior");
    lVar11 = 0x2e8b94;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior_enthalpies");
    lVar11 = 0x2e8eb4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior_1n");
    lVar11 = 0x2e9e54;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior_1n_enthalpies");
    lVar11 = 0x2ea174;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior_23");
    lVar11 = 0x2ea494;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_interior_23_enthalpies");
    lVar11 = 0x2ea7b4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_multi");
    lVar11 = 0x2e9814;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_multi_enthalpies");
    lVar11 = 0x2e9b34;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_exterior");
    lVar11 = 0x2eaad4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","mismatch_exterior_enthalpies");
    lVar11 = 0x2eadf4;
    lVar14 = 1;
    do {
      lVar6 = 0;
      do {
        display_array((int *)(lVar11 + lVar6),5,5,(FILE *)__s);
        lVar6 = lVar6 + 0x14;
      } while (lVar6 != 100);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 100;
    } while (lVar14 != 8);
    fprintf(__s,"\n# %s\n","dangle5");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    lVar11 = 0x14;
    do {
      display_array((int *)((long)dangle5_37[0] + lVar11),5,5,(FILE *)__s);
      lVar11 = lVar11 + 0x14;
    } while (lVar11 != 0xa0);
    fprintf(__s,"\n# %s\n","dangle5_enthalpies");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    lVar11 = 0x14;
    do {
      display_array((int *)((long)dangle5_dH[0] + lVar11),5,5,(FILE *)__s);
      lVar11 = lVar11 + 0x14;
    } while (lVar11 != 0xa0);
    fprintf(__s,"\n# %s\n","dangle3");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    lVar11 = 0x14;
    do {
      display_array((int *)((long)dangle3_37[0] + lVar11),5,5,(FILE *)__s);
      lVar11 = lVar11 + 0x14;
    } while (lVar11 != 0xa0);
    fprintf(__s,"\n# %s\n","dangle3_enthalpies");
    fwrite("/*  @     A     C     G     U   */\n",0x23,1,__s);
    lVar11 = 0x14;
    do {
      display_array((int *)((long)dangle3_dH[0] + lVar11),5,5,(FILE *)__s);
      lVar11 = lVar11 + 0x14;
    } while (lVar11 != 0xa0);
    fprintf(__s,"\n# %s\n","int11");
    lVar14 = 0x2ebe04;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        fprintf(__s,"/* %2s..%2s */\n",puVar2,(&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7]);
        lVar9 = 0;
        do {
          display_array((int *)(lVar6 + lVar9),5,5,(FILE *)__s);
          lVar9 = lVar9 + 0x14;
        } while (lVar9 != 100);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 100;
      } while (lVar7 != 8);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 800;
    } while (lVar11 != 8);
    fprintf(__s,"\n# %s\n","int11_enthalpies");
    lVar14 = 0x2ed704;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        fprintf(__s,"/* %2s..%2s */\n",puVar2,(&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7]);
        lVar9 = 0;
        do {
          display_array((int *)(lVar6 + lVar9),5,5,(FILE *)__s);
          lVar9 = lVar9 + 0x14;
        } while (lVar9 != 100);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 100;
      } while (lVar7 != 8);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 800;
    } while (lVar11 != 8);
    fprintf(__s,"\n# %s\n","int21");
    lVar14 = 0x2efe14;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        puVar3 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7];
        lVar5 = 0;
        lVar9 = lVar6;
        do {
          fprintf(__s,"/* %2s.%c..%2s */\n",puVar2,(ulong)(uint)(int)(char)(&DAT_002df3aa)[lVar5],
                  puVar3);
          lVar12 = 0;
          do {
            display_array((int *)(lVar12 + lVar9),5,5,(FILE *)__s);
            lVar12 = lVar12 + 0x14;
          } while (lVar12 != 100);
          lVar5 = lVar5 + 1;
          lVar9 = lVar9 + 100;
        } while (lVar5 != 5);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 500;
      } while (lVar7 != 8);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 4000;
    } while (lVar11 != 8);
    fprintf(__s,"\n# %s\n","int21_enthalpies");
    lVar14 = 0x2f7b14;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        puVar3 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7];
        lVar5 = 0;
        lVar9 = lVar6;
        do {
          fprintf(__s,"/* %2s.%c..%2s */\n",puVar2,(ulong)(uint)(int)(char)(&DAT_002df3aa)[lVar5],
                  puVar3);
          lVar12 = 0;
          do {
            display_array((int *)(lVar12 + lVar9),5,5,(FILE *)__s);
            lVar12 = lVar12 + 0x14;
          } while (lVar12 != 100);
          lVar5 = lVar5 + 1;
          lVar9 = lVar9 + 100;
        } while (lVar5 != 5);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 500;
      } while (lVar7 != 8);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 4000;
    } while (lVar11 != 8);
    fprintf(__s,"\n# %s\n","int22");
    lVar14 = 0x3040d4;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        puVar3 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7];
        lVar5 = 1;
        lVar9 = lVar6;
        do {
          cVar1 = (&DAT_002df3aa)[lVar5];
          lVar13 = 1;
          lVar12 = lVar9;
          do {
            fprintf(__s,"/* %2s.%c%c..%2s */\n",puVar2,(ulong)(uint)(int)cVar1,
                    (ulong)(uint)(int)(char)(&DAT_002df3aa)[lVar13],puVar3);
            lVar15 = 0;
            do {
              display_array((int *)(lVar15 + lVar12),4,5,(FILE *)__s);
              lVar15 = lVar15 + 0x14;
            } while (lVar15 != 0x50);
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 100;
          } while (lVar13 != 5);
          lVar5 = lVar5 + 1;
          lVar9 = lVar9 + 500;
        } while (lVar5 != 5);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x9c4;
      } while (lVar7 != 7);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 20000;
    } while (lVar11 != 7);
    fprintf(__s,"\n# %s\n","int22_enthalpies");
    lVar14 = 0x32b1d4;
    lVar11 = 1;
    do {
      puVar2 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar11];
      lVar7 = 1;
      lVar6 = lVar14;
      do {
        puVar3 = (&PTR_anon_var_dwarf_8aef3_002e7cf0)[lVar7];
        lVar5 = 1;
        lVar9 = lVar6;
        do {
          cVar1 = (&DAT_002df3aa)[lVar5];
          lVar13 = 1;
          lVar12 = lVar9;
          do {
            fprintf(__s,"/* %2s.%c%c..%2s */\n",puVar2,(ulong)(uint)(int)cVar1,
                    (ulong)(uint)(int)(char)(&DAT_002df3aa)[lVar13],puVar3);
            lVar15 = 0;
            do {
              display_array((int *)(lVar15 + lVar12),4,5,(FILE *)__s);
              lVar15 = lVar15 + 0x14;
            } while (lVar15 != 0x50);
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 100;
          } while (lVar13 != 5);
          lVar5 = lVar5 + 1;
          lVar9 = lVar9 + 500;
        } while (lVar5 != 5);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x9c4;
      } while (lVar7 != 7);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 20000;
    } while (lVar11 != 7);
    fprintf(__s,"\n# %s\n","hairpin");
    display_array(hairpin37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","hairpin_enthalpies");
    display_array(hairpindH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","bulge");
    display_array(bulge37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","bulge_enthalpies");
    display_array(bulgedH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","interior");
    display_array(internal_loop37,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","interior_enthalpies");
    display_array(internal_loopdH,0x1f,10,(FILE *)__s);
    fprintf(__s,"\n# %s\n","ML_params");
    fwrite("/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n",0x38,1,__s);
    fwrite("/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n",0x31,1,__s);
    fprintf(__s,"\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",(ulong)(uint)ML_BASE37,(ulong)(uint)ML_BASEdH,
            (ulong)(uint)ML_closing37,(ulong)(uint)ML_closingdH,(ulong)(uint)ML_intern37,
            (ulong)(uint)ML_interndH);
    fprintf(__s,"\n# %s\n","NINIO");
    fprintf(__s,"/* Ninio = MIN(max, m*|n1-n2| */\n/*\t    m\t  m_dH     max  */\n\t%6d\t%6d\t%6d\n"
            ,(ulong)(uint)ninio37,(ulong)(uint)niniodH,(ulong)(uint)MAX_NINIO);
    fprintf(__s,"\n# %s\n","Misc");
    fwrite("/* all parameters are pairs of \'energy enthalpy\' */\n",0x34,1,__s);
    fwrite("/*    DuplexInit     TerminalAU      LXC */\n",0x2c,1,__s);
    fprintf(__s,"   %6d %6d %6d  %6d %3.6f %6d\n",lxc37,(ulong)(uint)DuplexInit37,
            (ulong)(uint)DuplexInitdH,(ulong)(uint)TerminalAU37,(ulong)(uint)TerminalAUdH,0);
    fprintf(__s,"\n# %s\n","Hexaloops");
    sVar4 = strlen(Hexaloops);
    if (8 < sVar4) {
      pcVar8 = Hexaloops;
      uVar10 = 0;
      do {
        fprintf(__s,"\t%.8s %6d %6d\n",pcVar8,(ulong)(uint)Hexaloop37[uVar10],
                (ulong)(uint)HexaloopdH[uVar10]);
        uVar10 = uVar10 + 1;
        sVar4 = strlen(Hexaloops);
        pcVar8 = pcVar8 + 9;
      } while (uVar10 < sVar4 / 9);
    }
    fprintf(__s,"\n# %s\n","Tetraloops");
    sVar4 = strlen(Tetraloops);
    if (6 < sVar4) {
      pcVar8 = Tetraloops;
      uVar10 = 0;
      do {
        fprintf(__s,"\t%.6s %6d %6d\n",pcVar8,(ulong)(uint)Tetraloop37[uVar10],
                (ulong)(uint)TetraloopdH[uVar10]);
        uVar10 = uVar10 + 1;
        sVar4 = strlen(Tetraloops);
        pcVar8 = pcVar8 + 7;
      } while (uVar10 < sVar4 / 7);
    }
    fprintf(__s,"\n# %s\n","Triloops");
    sVar4 = strlen(Triloops);
    if (5 < sVar4) {
      pcVar8 = Triloops;
      uVar10 = 0;
      do {
        fprintf(__s,"\t%.5s %6d %6d\n",pcVar8,(ulong)(uint)Triloop37[uVar10],
                (ulong)(uint)TriloopdH[uVar10]);
        uVar10 = uVar10 + 1;
        sVar4 = strlen(Triloops);
        pcVar8 = pcVar8 + 6;
      } while (uVar10 < sVar4 / 6);
    }
    fprintf(__s,"\n# %s\n","END");
    fclose(__s);
    return;
  }
  vrna_message_error("can\'t open file %s",fname);
}

Assistant:

PUBLIC void
write_parameter_file(const char fname[])
{
  FILE  *outfp;
  int   c;
  char  *pnames[] = {
    "NP", "CG", "GC", "GU", "UG", "AU", "UA", " @"
  };
  char  bnames[] = "@ACGU";

  outfp = fopen(fname, "w");
  if (!outfp) {
    vrna_message_error("can't open file %s", fname);
    exit(1);
  }

  fprintf(outfp, "## RNAfold parameter file v2.0\n");

  fprintf(outfp, "\n# %s\n", settype(S));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stack37[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(S_H));
  fprintf(outfp, "/*  CG    GC    GU    UG    AU    UA    @  */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(stackdH[c] + 1, NBPAIRS, NBPAIRS, outfp);

  fprintf(outfp, "\n# %s\n", settype(MMH));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchH37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMH_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchHdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nI37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI1N_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch1nIdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23I37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMI23_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatch23IdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchM37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MMM_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchMdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExt37[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(MME_H));
  {
    int i, k;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (i = 0; i < 5; i++)
        display_array(mismatchExtdH[k][i], 5, 5, outfp);
  }

  fprintf(outfp, "\n# %s\n", settype(D5));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D5_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle5_dH[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_37[c], 5, 5, outfp);

  fprintf(outfp, "\n# %s\n", settype(D3_H));
  fprintf(outfp, "/*  @     A     C     G     U   */\n");
  for (c = 1; c < NBPAIRS + 1; c++)
    display_array(dangle3_dH[c], 5, 5, outfp);


  /* dont print "no pair" entries for interior loop arrays */
  fprintf(outfp, "\n# %s\n", settype(INT11));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_37[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT11_H));
  {
    int i, k, l;
    for (k = 1; k < NBPAIRS + 1; k++)
      for (l = 1; l < NBPAIRS + 1; l++) {
        fprintf(outfp, "/* %2s..%2s */\n", pnames[k], pnames[l]);
        for (i = 0; i < 5; i++)
          display_array(int11_dH[k][l][i], 5, 5, outfp);
      }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_37[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT21_H));
  {
    int p1, p2, i, j;
    for (p1 = 1; p1 < NBPAIRS + 1; p1++)
      for (p2 = 1; p2 < NBPAIRS + 1; p2++)
        for (i = 0; i < 5; i++) {
          fprintf(outfp, "/* %2s.%c..%2s */\n",
                  pnames[p1], bnames[i], pnames[p2]);
          for (j = 0; j < 5; j++)
            display_array(int21_dH[p1][p2][i][j], 5, 5, outfp);
        }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_37[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(INT22_H));
  {
    int p1, p2, i, j, k;
    for (p1 = 1; p1 < NBPAIRS; p1++)
      for (p2 = 1; p2 < NBPAIRS; p2++)
        for (i = 1; i < 5; i++)
          for (j = 1; j < 5; j++) {
            fprintf(outfp, "/* %2s.%c%c..%2s */\n",
                    pnames[p1], bnames[i], bnames[j], pnames[p2]);
            for (k = 1; k < 5; k++)
              display_array(int22_dH[p1][p2][i][j][k] + 1, 4, 5, outfp);
          }
  }

  fprintf(outfp, "\n# %s\n", settype(HP));
  display_array(hairpin37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(HP_H));
  display_array(hairpindH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B));
  display_array(bulge37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(B_H));
  display_array(bulgedH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL));
  display_array(internal_loop37, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(IL_H));
  display_array(internal_loopdH, 31, 10, outfp);

  fprintf(outfp, "\n# %s\n", settype(ML));
  fprintf(outfp, "/* F = cu*n_unpaired + cc + ci*loop_degree (+TermAU) */\n");
  fprintf(outfp, "/*\t    cu\t cu_dH\t    cc\t cc_dH\t    ci\t ci_dH  */\n");
  fprintf(outfp,
          "\t%6d\t%6d\t%6d\t%6d\t%6d\t%6d\n",
          ML_BASE37,
          ML_BASEdH,
          ML_closing37,
          ML_closingdH,
          ML_intern37,
          ML_interndH);

  fprintf(outfp, "\n# %s\n", settype(NIN));
  fprintf(outfp, "/* Ninio = MIN(max, m*|n1-n2| */\n"
          "/*\t    m\t  m_dH     max  */\n"
          "\t%6d\t%6d\t%6d\n", ninio37, niniodH, MAX_NINIO);

  fprintf(outfp, "\n# %s\n", settype(MISC));
  fprintf(outfp, "/* all parameters are pairs of 'energy enthalpy' */\n");
  fprintf(outfp, "/*    DuplexInit     TerminalAU      LXC */\n");
  fprintf(outfp,
          "   %6d %6d %6d  %6d %3.6f %6d\n",
          DuplexInit37,
          DuplexInitdH,
          TerminalAU37,
          TerminalAUdH,
          lxc37,
          0);

  fprintf(outfp, "\n# %s\n", settype(HEX));
  for (c = 0; c < strlen(Hexaloops) / 9; c++)
    fprintf(outfp, "\t%.8s %6d %6d\n", Hexaloops + c * 9, Hexaloop37[c], HexaloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TL));
  for (c = 0; c < strlen(Tetraloops) / 7; c++)
    fprintf(outfp, "\t%.6s %6d %6d\n", Tetraloops + c * 7, Tetraloop37[c], TetraloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(TRI));
  for (c = 0; c < strlen(Triloops) / 6; c++)
    fprintf(outfp, "\t%.5s %6d %6d\n", Triloops + c * 6, Triloop37[c], TriloopdH[c]);

  fprintf(outfp, "\n# %s\n", settype(QUIT));
  fclose(outfp);
}